

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicHeap.hpp
# Opt level: O3

void __thiscall
Diligent::DynamicHeap::MasterBlockListBasedManager::~MasterBlockListBasedManager
          (MasterBlockListBasedManager *this)

{
  char (*in_RCX) [55];
  string msg;
  string local_28;
  
  if ((this->m_MasterBlockCounter).super___atomic_base<int>._M_i != 0) {
    FormatString<std::atomic<int>,char[55]>
              (&local_28,(Diligent *)&this->m_MasterBlockCounter,
               (atomic<int> *)" master block(s) have not been returned to the manager",in_RCX);
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"~MasterBlockListBasedManager",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/DynamicHeap.hpp"
               ,0x7a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
  }
  VariableSizeAllocationsManager::~VariableSizeAllocationsManager(&this->m_AllocationsMgr);
  return;
}

Assistant:

~MasterBlockListBasedManager()
    {
        DEV_CHECK_ERR(m_MasterBlockCounter == 0, m_MasterBlockCounter, " master block(s) have not been returned to the manager");
    }